

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O0

bool __thiscall PClassPlayerPawn::GetPainFlash(PClassPlayerPawn *this,FName *type,PalEntry *color)

{
  TMap<FName,_PalEntry,_THashTraits<FName>,_TValueTraits<PalEntry>_> *this_00;
  FName local_3c;
  anon_union_4_2_12391d7c_for_PalEntry_0 *local_38;
  PalEntry *flash;
  PClassPlayerPawn *info;
  PalEntry *color_local;
  FName *type_local;
  PClassPlayerPawn *this_local;
  
  flash = (PalEntry *)this;
  info = (PClassPlayerPawn *)color;
  color_local = (PalEntry *)type;
  type_local = (FName *)this;
  while( true ) {
    if (flash == (PalEntry *)0x0) {
      return false;
    }
    this_00 = (TMap<FName,_PalEntry,_THashTraits<FName>,_TValueTraits<PalEntry>_> *)(flash + 0xa0);
    FName::FName(&local_3c,type);
    local_38 = &TMap<FName,_PalEntry,_THashTraits<FName>,_TValueTraits<PalEntry>_>::CheckKey
                          (this_00,&local_3c)->field_0;
    if (local_38 != (anon_union_4_2_12391d7c_for_PalEntry_0 *)0x0) break;
    flash = (PalEntry *)dyn_cast<PClassPlayerPawn>(*(DObject **)(flash + 0x2c));
  }
  *(anon_union_4_2_12391d7c_for_PalEntry_0 *)
   &(info->super_PClassActor).super_PClass.super_PStruct.super_PNamedType.super_PCompoundType.
    super_PType.super_DObject = *local_38;
  return true;
}

Assistant:

bool PClassPlayerPawn::GetPainFlash(FName type, PalEntry *color) const
{
	const PClassPlayerPawn *info = this;

	while (info != NULL)
	{
		const PalEntry *flash = info->PainFlashes.CheckKey(type);
		if (flash != NULL)
		{
			*color = *flash;
			return true;
		}
		// Try parent class
		info = dyn_cast<PClassPlayerPawn>(info->ParentClass);
	}
	return false;
}